

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Convolution2D.cpp
# Opt level: O1

void __thiscall layer::Convolution2D::predict(Convolution2D *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  tensor ppplVar8;
  tensor *pppplVar9;
  undefined1 auVar10 [16];
  longdouble lVar11;
  longdouble lVar12;
  longdouble lVar13;
  longdouble lVar14;
  longdouble lVar15;
  longdouble *plVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  ulong uVar22;
  Convolution2D *pCVar23;
  long lVar24;
  uint uVar25;
  long lVar26;
  longdouble in_ST0;
  longdouble lVar27;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  undefined6 in_stack_ffffffffffffff92;
  int local_58;
  int local_50;
  
  if (0 < (this->super_Layer)._sizeZOut) {
    lVar26 = 0;
    pCVar23 = this;
    do {
      if (0 < (this->super_Layer)._sizeYOut) {
        lVar19 = 0;
        do {
          if (0 < (this->super_Layer)._sizeXOut) {
            lVar21 = 0;
            lVar27 = in_ST0;
            lVar11 = in_ST1;
            lVar12 = in_ST2;
            lVar13 = in_ST3;
            lVar14 = in_ST4;
            lVar15 = in_ST5;
            do {
              in_ST5 = in_ST6;
              in_ST4 = lVar15;
              in_ST3 = lVar14;
              in_ST2 = lVar13;
              in_ST1 = lVar12;
              in_ST0 = lVar11;
              plVar16 = (this->super_Layer)._out[lVar26][lVar19];
              plVar16[lVar21] = (longdouble)0;
              plVar16 = plVar16 + lVar21;
              lVar17 = (long)(this->super_Layer)._sizeZWeight;
              if (0 < lVar17) {
                iVar1 = this->_stepY;
                local_58 = (int)lVar19;
                iVar2 = this->_zeroPaddingY;
                uVar3 = (this->super_Layer)._sizeYWeight;
                uVar4 = this->_sizeYIn;
                pCVar23 = (Convolution2D *)(ulong)uVar4;
                lVar24 = 0;
                do {
                  if (0 < (int)uVar3) {
                    iVar5 = this->_stepX;
                    local_50 = (int)lVar21;
                    iVar6 = this->_zeroPaddingX;
                    uVar7 = (this->super_Layer)._sizeXWeight;
                    uVar22 = 0;
                    uVar20 = iVar1 * local_58 - iVar2;
                    do {
                      if ((-1 < (int)uVar20 && 0 < (int)uVar7) && (int)uVar20 < (int)uVar4) {
                        ppplVar8 = (this->super_Layer)._in;
                        pppplVar9 = (this->super_Layer)._ptrWeight;
                        lVar18 = 0;
                        uVar25 = iVar5 * local_50 - iVar6;
                        do {
                          if ((int)uVar25 < (int)uVar4 && -1 < (int)uVar25) {
                            *plVar16 = *plVar16 +
                                       ppplVar8[lVar24][uVar20][uVar25] *
                                       *(longdouble *)
                                        ((long)pppplVar9[lVar26][lVar24][uVar22] + lVar18);
                            in_ST5 = in_ST4;
                          }
                          uVar25 = uVar25 + 1;
                          lVar18 = lVar18 + 0x10;
                        } while ((ulong)uVar7 << 4 != lVar18);
                      }
                      uVar20 = uVar20 + 1;
                      uVar22 = uVar22 + 1;
                    } while (uVar22 != uVar3);
                  }
                  lVar24 = lVar24 + 1;
                } while (lVar24 != lVar17);
              }
              auVar10._10_6_ = in_stack_ffffffffffffff92;
              auVar10._0_10_ = *plVar16;
              in_ST6 = in_ST5;
              (*(this->super_Layer)._fActivation)((scalar *)pCVar23,(scalar)auVar10);
              (this->super_Layer)._out[lVar26][lVar19][lVar21] = lVar27;
              lVar21 = lVar21 + 1;
              lVar27 = in_ST0;
              lVar11 = in_ST1;
              lVar12 = in_ST2;
              lVar13 = in_ST3;
              lVar14 = in_ST4;
              lVar15 = in_ST5;
            } while (lVar21 < (this->super_Layer)._sizeXOut);
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 < (this->super_Layer)._sizeYOut);
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 < (this->super_Layer)._sizeZOut);
  }
  return;
}

Assistant:

void Convolution2D::predict()
    {
        int posXIn = 0;
        int posYIn = 0;


        for (int posZOut(0); posZOut < _sizeZOut; posZOut++) {
            for (int posYOut(0); posYOut < _sizeYOut; posYOut++) {
                for (int posXOut(0); posXOut < _sizeXOut; posXOut++) {
                    _out[posZOut][posYOut][posXOut] = 0;

                    for (int posZKernel(0); posZKernel < _sizeZWeight; posZKernel++) {
                        posYIn = (posYOut * _stepY) - _zeroPaddingY;
                        for (int posYKernel(0); posYKernel < _sizeYWeight; posYKernel++) {
                            if((posYIn >= 0) & (posYIn < _sizeYIn)) {
                                posXIn = (posXOut * _stepX) - _zeroPaddingX;
                                for (int posXKernel(0); posXKernel < _sizeXWeight; posXKernel++) {
                                    if((posXIn >= 0) & (posXIn < _sizeYIn)) {
                                        _out[posZOut][posYOut][posXOut] +=
                                                _ptrWeight[posZOut][posZKernel][posYKernel][posXKernel] *
                                                _in[posZKernel][posYIn][posXIn];
                                    }
                                    posXIn++;
                                }
                            }
                            posYIn++;
                        }
                    }
                    _out[posZOut][posYOut][posXOut] = _fActivation(_out[posZOut][posYOut][posXOut]);

                }
            }
        }
    }